

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool decodeImmediateSize(char **encoding,MipsImmediateType *dest)

{
  MipsImmediateType MVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  
  if (**encoding == 'h') {
    *encoding = *encoding + 1;
    MVar1 = ImmediateHalfFloat;
  }
  else {
    pcVar2 = *encoding;
    cVar4 = *pcVar2;
    iVar3 = 0;
    if ((byte)(cVar4 - 0x30U) < 10) {
      iVar3 = 0;
      do {
        pcVar2 = pcVar2 + 1;
        iVar3 = (int)cVar4 + iVar3 * 10 + -0x30;
        *encoding = pcVar2;
        cVar4 = *pcVar2;
      } while ((byte)(cVar4 - 0x30U) < 10);
    }
    if (iVar3 < 0x10) {
      if (iVar3 == 5) {
        MVar1 = Immediate5;
      }
      else if (iVar3 == 7) {
        MVar1 = Immediate7;
      }
      else {
        if (iVar3 != 10) {
          return false;
        }
        MVar1 = Immediate10;
      }
    }
    else if (iVar3 < 0x19) {
      if (iVar3 == 0x10) {
        MVar1 = Immediate16;
      }
      else {
        if (iVar3 != 0x14) {
          return false;
        }
        MVar1 = Immediate20;
      }
    }
    else if (iVar3 == 0x19) {
      MVar1 = Immediate25;
    }
    else {
      if (iVar3 != 0x1a) {
        return false;
      }
      MVar1 = Immediate26;
    }
  }
  *dest = MVar1;
  return true;
}

Assistant:

static bool decodeImmediateSize(const char*& encoding, MipsImmediateType& dest)
{
	if (*encoding == 'h')	// half float
	{
		encoding++;
		dest = MipsImmediateType::ImmediateHalfFloat;
	} else {
		int num = 0;
		while (*encoding >= '0' && *encoding <= '9')
		{
			num = num*10 + *encoding-'0';
			encoding++;
		}

		switch (num)
		{
		case 5:
			dest = MipsImmediateType::Immediate5;
			break;
		case 7:
			dest = MipsImmediateType::Immediate7;
			break;
		case 10:
			dest = MipsImmediateType::Immediate10;
			break;
		case 16:
			dest = MipsImmediateType::Immediate16;
			break;
		case 20:
			dest = MipsImmediateType::Immediate20;
			break;
		case 25:
			dest = MipsImmediateType::Immediate25;
			break;
		case 26:
			dest = MipsImmediateType::Immediate26;
			break;
		default:
			return false;
		}
	}

	return true;
}